

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O0

int fp_test_hdu(fitsfile *infptr,fitsfile *outfptr,int *outfptr2,int *param_4)

{
  char in_stack_0000049c;
  undefined1 local_b8 [8];
  unsigned_long hdusum;
  unsigned_long datasum2;
  unsigned_long datasum1;
  float row_cpu;
  float whole_cpu;
  float row_elapse;
  float whole_elapse;
  float elapse;
  float unpackcpu;
  float packcpu;
  float compratio;
  float compressdata;
  float origdata;
  long dataend;
  long datastart;
  long headstart;
  char local_58 [4];
  char lossless [4];
  char ctype [20];
  int local_3c;
  undefined1 local_38 [4];
  int comptype;
  int hdutype;
  int stat;
  int *status_local;
  fitsfile *outfptr2_local;
  fitsfile *outfptr_local;
  fitsfile *infptr_local;
  
  comptype = 0;
  elapse = 0.0;
  whole_elapse = 0.0;
  if (*param_4 == 0) {
    compratio = 0.0;
    packcpu = 0.0;
    unpackcpu = 0.0;
    headstart._4_1_ = 0;
    _hdutype = param_4;
    status_local = outfptr2;
    outfptr2_local = outfptr;
    outfptr_local = infptr;
    fits_get_compression_type(outfptr,&local_3c,&comptype);
    if (local_3c == 0xb) {
      strcpy(local_58,"RICE");
    }
    else if (local_3c == 0x15) {
      strcpy(local_58,"GZIP1");
    }
    else if (local_3c == 0x16) {
      strcpy(local_58,"GZIP2");
    }
    else if (local_3c == 0x1f) {
      strcpy(local_58,"PLIO");
    }
    else if (local_3c == 0x29) {
      strcpy(local_58,"HCOMP");
    }
    else {
      if (local_3c != -1) {
        fp_msg("Error: unsupported image compression type ");
        *_hdutype = 0x19d;
        return 0;
      }
      strcpy(local_58,"NONE");
    }
    marktime(&comptype);
    fits_img_compress(outfptr_local,outfptr2_local,&comptype);
    gettime(&row_elapse,&elapse,&comptype);
    fits_read_image_speed
              (outfptr2_local,&whole_cpu,(float *)((long)&datasum1 + 4),&row_cpu,(float *)&datasum1,
               &comptype);
    if (comptype == 0) {
      marktime(&comptype);
      fits_img_decompress(outfptr2_local,status_local,&comptype);
      gettime(&row_elapse,&whole_elapse,&comptype);
      ffghad(outfptr_local,&datastart,&dataend,&compressdata,&comptype);
      compratio = (float)((double)(_compressdata - dataend) / 1000000.0);
      ffghad(outfptr2_local,&datastart,&dataend,&compressdata,&comptype);
      packcpu = (float)((double)(_compressdata - dataend) / 1000000.0);
      if ((packcpu != 0.0) || (NAN(packcpu))) {
        unpackcpu = compratio / packcpu;
      }
      ffgcks(outfptr_local,&datasum2,local_b8,&comptype);
      ffgcks(status_local,&hdusum,local_b8,&comptype);
      if (datasum2 == hdusum) {
        strcpy((char *)((long)&headstart + 4),"Yes");
      }
      else {
        strcpy((char *)((long)&headstart + 4),"No");
      }
      printf("       %-5s %6.2f %7.2f ->%7.2f %7.2f %7.2f %s %5.3f %5.3f %5.3f %5.3f\n",
             (double)unpackcpu,(double)compratio,(double)packcpu,(double)elapse,(double)whole_elapse
             ,(double)whole_cpu,(double)datasum1._4_4_,(double)row_cpu,local_58,(long)&headstart + 4
            );
      if (in_stack_0000049c != '\0') {
        fprintf((FILE *)outreport," %6.3f %5.2f %5.2f %s %7.3f %7.3f %7.3f %7.3f",(double)unpackcpu,
                (double)elapse,(double)whole_elapse,(double)whole_cpu,(double)datasum1._4_4_,
                (double)row_cpu,(double)(float)datasum1,(long)&headstart + 4);
      }
      ffdhdu(outfptr2_local,local_38,&comptype);
      ffdhdu(status_local,local_38,&comptype);
    }
    else {
      printf("       %-5s     (unable to compress image)\n",local_58);
    }
    if (comptype == 0x19d) {
      comptype = 0;
    }
    *_hdutype = comptype;
  }
  return 0;
}

Assistant:

int fp_test_hdu (fitsfile *infptr, fitsfile *outfptr, fitsfile *outfptr2, 
	fpstate fpvar, int *status)
{
   /*   This routine is only used for performance testing of image HDUs. */
   /*   Use fp_test_table for testing binary table HDUs.    */

	int stat = 0, hdutype, comptype;
        char ctype[20], lossless[4];
	long headstart, datastart, dataend;
	float origdata = 0., compressdata = 0.;
	float compratio = 0., packcpu = 0., unpackcpu = 0.;
	float elapse, whole_elapse, row_elapse, whole_cpu, row_cpu;
	unsigned long datasum1, datasum2, hdusum;

	if (*status) return(0);

	origdata = 0;
	compressdata = 0;
	compratio = 0.;
	lossless[0] = '\0';

	fits_get_compression_type(outfptr, &comptype, &stat);
	if (comptype == RICE_1)
		strcpy(ctype, "RICE");
	else if (comptype == GZIP_1)
		strcpy(ctype, "GZIP1");
	else if (comptype == GZIP_2)
		strcpy(ctype, "GZIP2");/*
	else if (comptype == BZIP2_1)
		strcpy(ctype, "BZIP2");
*/
	else if (comptype == PLIO_1)
		strcpy(ctype, "PLIO");
	else if (comptype == HCOMPRESS_1)
		strcpy(ctype, "HCOMP");
	else if (comptype == NOCOMPRESS)
		strcpy(ctype, "NONE");
	else {
	      fp_msg ("Error: unsupported image compression type ");
	      *status = DATA_COMPRESSION_ERR;
	      return(0);
	}

	/* -------------- COMPRESS the image ------------------ */

	marktime(&stat);
	
	fits_img_compress (infptr, outfptr, &stat);

	/* get elapsped times */
	gettime(&elapse, &packcpu, &stat);

	/* get elapsed and cpu times need to read the compressed image */
	fits_read_image_speed (outfptr, &whole_elapse, &whole_cpu, 
	   &row_elapse, &row_cpu, &stat);

        if (!stat) {

		/* -------------- UNCOMPRESS the image ------------------ */

                /* remove any cached uncompressed tile 
		  (dangerous to directly modify the structure!) */
        /*        (outfptr->Fptr)->tilerow = 0; */
		marktime(&stat);

 	       fits_img_decompress (outfptr, outfptr2, &stat);

		/* get elapsped times */
		gettime(&elapse, &unpackcpu, &stat);

		/* ----------------------------------------------------- */


		/* get sizes of original and compressed images */

		fits_get_hduaddr(infptr, &headstart, &datastart, &dataend, &stat);
		origdata = (float) ((dataend - datastart)/1000000.);
		
		fits_get_hduaddr(outfptr, &headstart, &datastart, &dataend, &stat);
		compressdata = (float) ((dataend - datastart)/1000000.);

		if (compressdata != 0)
			compratio = (float) origdata / (float) compressdata;

		/* is this uncompressed image identical to the original? */

		fits_get_chksum(infptr, &datasum1, &hdusum, &stat);	    
		fits_get_chksum(outfptr2, &datasum2, &hdusum, &stat);

		if ( datasum1 == datasum2) {
			strcpy(lossless, "Yes");
		} else {
			strcpy(lossless, "No");
		}

		printf("       %-5s %6.2f %7.2f ->%7.2f %7.2f %7.2f %s %5.3f %5.3f %5.3f %5.3f\n", 
			ctype, compratio, origdata, compressdata, 
			packcpu, unpackcpu, lossless, whole_elapse, whole_cpu,
			row_elapse, row_cpu);


		if (fpvar.outfile[0]) {
		    fprintf(outreport," %6.3f %5.2f %5.2f %s %7.3f %7.3f %7.3f %7.3f", 
		       compratio, packcpu, unpackcpu, lossless,  whole_elapse, whole_cpu,
		       row_elapse, row_cpu);
		}

 	       /* delete the output HDUs to concerve disk space */

		fits_delete_hdu(outfptr, &hdutype, &stat);
		fits_delete_hdu(outfptr2, &hdutype, &stat);

	} else {
		printf("       %-5s     (unable to compress image)\n", ctype);
	}

	/* try to recover from any compression errors */
	if (stat == DATA_COMPRESSION_ERR) stat = 0;

	*status = stat;
        return(0);
}